

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O3

bool __thiscall
libaom_examples::anon_unknown_0::validate_layer
          (anon_unknown_0 *this,LayerMetadata *layer,bool layer_has_alpha,bool layer_has_depth)

{
  undefined1 in_AL;
  undefined3 in_register_00000011;
  uint uVar1;
  uint uVar2;
  
  uVar1 = (uint)(1 < (int)layer);
  uVar2 = 0;
  if ((int)this == 5) {
    uVar2 = uVar1;
  }
  if (uVar2 == CONCAT31(in_register_00000011,layer_has_alpha)) {
    uVar2 = 0;
    if ((int)this == 6) {
      uVar2 = uVar1;
    }
    if (uVar2 != layer_has_depth) {
      _GLOBAL__N_1::validate_layer();
    }
  }
  else {
    _GLOBAL__N_1::validate_layer();
  }
  return (bool)in_AL;
}

Assistant:

bool validate_layer(const LayerMetadata &layer, bool layer_has_alpha,
                    bool layer_has_depth) {
  if (layer_has_alpha != (layer.layer_type == MULTILAYER_LAYER_TYPE_ALPHA &&
                          layer.layer_metadata_scope >= SCOPE_GLOBAL)) {
    fprintf(stderr,
            "Error: alpha info must be set if and only if layer_type is "
            "%d and layer_metadata_scpoe is >= %d\n",
            MULTILAYER_LAYER_TYPE_ALPHA, SCOPE_GLOBAL);
    return false;
  }
  if (layer_has_depth != (layer.layer_type == MULTILAYER_LAYER_TYPE_DEPTH &&
                          layer.layer_metadata_scope >= SCOPE_GLOBAL)) {
    fprintf(stderr,
            "Error: depth info must be set if and only if layer_type is "
            "%d and layer_metadata_scpoe is >= %d\n",
            MULTILAYER_LAYER_TYPE_DEPTH, SCOPE_GLOBAL);
    return false;
  }
  return true;
}